

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O1

void __thiscall Win32MakefileGenerator::processRcFileVar(Win32MakefileGenerator *this)

{
  QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *this_00;
  QString file;
  QString string;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  QArrayData *pQVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  Data *pDVar11;
  undefined8 uVar12;
  Data *pDVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  char cVar17;
  byte bVar18;
  int iVar19;
  int iVar20;
  ProStringList *pPVar21;
  pointer pQVar22;
  QTextStream *pQVar23;
  QString *pQVar24;
  QList<ProString> *pQVar25;
  iterator iVar26;
  QMovableArrayOps<ProString> *this_01;
  ProStringList *pPVar27;
  ProString *icon;
  ProString *pPVar28;
  QFile *this_02;
  QMakeProject *pQVar29;
  int iVar31;
  ulong uVar32;
  MakefileGenerator *this_03;
  char *pcVar33;
  ProString *this_04;
  ProString *this_05;
  long lVar34;
  MakefileGenerator *pMVar35;
  long in_FS_OFFSET;
  bool bVar36;
  bool bVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QAnyStringView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QStringView QVar52;
  QLatin1String QVar53;
  QByteArrayView QVar54;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QStringView QVar55;
  QFileInfo fi;
  bool ok;
  QString QStackY_5e8;
  long lStackY_5d0;
  QFile *pQStackY_5c8;
  ProString *pPStackY_5c0;
  undefined1 in_stack_fffffffffffffa48 [12];
  undefined4 in_stack_fffffffffffffa54;
  MakefileGenerator *pMVar56;
  QArrayData *local_5a0;
  QArrayData *local_598;
  ProKey local_578;
  ProString local_548;
  ProKey local_518;
  undefined1 local_4e8 [64];
  QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> local_4a8;
  QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> local_438;
  char (*local_3d0) [10];
  undefined1 local_3c8 [56];
  ProString local_390;
  char (*local_360) [10];
  char (*local_358) [4];
  QString local_348;
  QArrayData *local_328;
  Data *pDStack_320;
  Data *local_318;
  QArrayData *local_308;
  Data *pDStack_300;
  Data *local_2f8;
  QArrayData *local_2e8;
  Data *pDStack_2e0;
  Data *local_2d8;
  ProString local_2c8;
  QArrayData *local_298;
  Data *pDStack_290;
  Data *local_288;
  QArrayData *local_278;
  Data *pDStack_270;
  Data *local_268;
  QArrayData *local_258;
  Data *pDStack_250;
  Data *local_248;
  QArrayData *local_238;
  Data *pDStack_230;
  Data *local_228;
  QArrayData *local_218;
  Data *pDStack_210;
  Data *local_208;
  QArrayDataPointer<ProString> local_1f8;
  QArrayDataPointer<QString> local_1d8;
  QArrayData *local_1b8;
  Data *pDStack_1b0;
  Data *local_1a8;
  QArrayDataPointer<QString> local_198;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  QArrayData *local_168;
  void *pvStack_160;
  Data *local_158;
  ProKey local_148;
  ProKey local_118;
  ProKey local_e8;
  ProKey local_b8;
  ProKey local_88;
  QString local_58;
  long local_38;
  undefined7 uVar30;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Option::qmake_mode == QMAKE_GENERATE_NOTHING) goto LAB_00255772;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar29 = (this->super_MakefileGenerator).project;
  pPStackY_5c0 = (ProString *)0x252473;
  ProKey::ProKey((ProKey *)&local_438,"QMAKE_MANIFEST");
  pPStackY_5c0 = (ProString *)0x252489;
  QMakeEvaluator::first((ProString *)local_3c8,&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
  pPStackY_5c0 = (ProString *)0x252494;
  ProString::toQString(&local_58,(ProString *)local_3c8);
  if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x2524b9;
      QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
    }
  }
  if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      pPStackY_5c0 = (ProString *)0x2524e2;
      QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar29 = (this->super_MakefileGenerator).project;
  pPStackY_5c0 = (ProString *)0x252500;
  ProKey::ProKey((ProKey *)local_3c8,"VERSION");
  pPStackY_5c0 = (ProString *)0x25250b;
  pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
  bVar36 = (pPVar21->super_QList<ProString>).d.size == 0;
  pMVar35 = &this->super_MakefileGenerator;
  if (bVar36) {
    pQVar29 = (this->super_MakefileGenerator).project;
    pPStackY_5c0 = (ProString *)0x252539;
    ProKey::ProKey(&local_88,"RC_ICONS");
    pPStackY_5c0 = (ProString *)0x252544;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,&local_88);
    if (((pPVar21->super_QList<ProString>).d.size != 0) ||
       ((undefined1 *)local_58.d.size != (undefined1 *)0x0)) goto LAB_0025255a;
    iVar31 = CONCAT31((int3)((uint)in_stack_fffffffffffffa54 >> 8),1);
    bVar16 = false;
    bVar36 = true;
    bVar14 = false;
    bVar15 = false;
LAB_00252628:
    bVar6 = bVar15;
    bVar5 = bVar14;
    bVar4 = bVar36;
    bVar2 = bVar16;
    pQVar29 = pMVar35->project;
    pPStackY_5c0 = (ProString *)0x25264b;
    ProKey::ProKey(&local_148,"QMAKE_WRITE_DEFAULT_RC");
    pPStackY_5c0 = (ProString *)0x252656;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,&local_148);
    bVar37 = (pPVar21->super_QList<ProString>).d.size != 0;
    bVar3 = (bool)(bVar2 ^ 1);
    bVar1 = true;
  }
  else {
LAB_0025255a:
    pQVar29 = (this->super_MakefileGenerator).project;
    pPStackY_5c0 = (ProString *)0x252578;
    ProKey::ProKey(&local_b8,"RC_FILE");
    pPStackY_5c0 = (ProString *)0x252583;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,&local_b8);
    iVar31 = CONCAT31((int3)((uint)in_stack_fffffffffffffa54 >> 8),bVar36);
    if ((pPVar21->super_QList<ProString>).d.size != 0) {
      bVar36 = true;
      bVar14 = false;
LAB_00252625:
      bVar16 = false;
      bVar15 = true;
      goto LAB_00252628;
    }
    pQVar29 = (this->super_MakefileGenerator).project;
    pPStackY_5c0 = (ProString *)0x2525bb;
    ProKey::ProKey(&local_e8,"RES_FILE");
    pPStackY_5c0 = (ProString *)0x2525c6;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,&local_e8);
    bVar14 = true;
    if ((pPVar21->super_QList<ProString>).d.size != 0) {
      bVar36 = true;
      goto LAB_00252625;
    }
    pQVar29 = (this->super_MakefileGenerator).project;
    pPStackY_5c0 = (ProString *)0x2525fb;
    QVar38.m_data = (storage_type *)0x18;
    QVar38.m_size = (qsizetype)&local_438;
    QString::fromUtf8(QVar38);
    local_598 = &(local_438.a.a.m_string.d.d)->super_QArrayData;
    bVar36 = false;
    pPStackY_5c0 = (ProString *)0x25261a;
    config.m_data = local_438.a.a.m_string.d.ptr;
    config.m_size = local_438.a.a.m_string.d.size;
    bVar16 = QMakeEvaluator::isActiveConfig(&pQVar29->super_QMakeEvaluator,config,false);
    if (bVar16) goto LAB_00252625;
    pQVar29 = (this->super_MakefileGenerator).project;
    pPStackY_5c0 = (ProString *)0x2548ae;
    QVar51.m_data = (storage_type *)0x6;
    QVar51.m_size = (qsizetype)&local_438;
    QString::fromUtf8(QVar51);
    local_5a0 = &(local_438.a.a.m_string.d.d)->super_QArrayData;
    bVar4 = false;
    pPStackY_5c0 = (ProString *)0x2548cd;
    config_01.m_data = local_438.a.a.m_string.d.ptr;
    config_01.m_size = local_438.a.a.m_string.d.size;
    bVar36 = QMakeEvaluator::isActiveConfig(&pQVar29->super_QMakeEvaluator,config_01,false);
    if (bVar36) {
      bVar5 = true;
      bVar3 = false;
      bVar2 = false;
      bVar1 = false;
      bVar6 = true;
      bVar37 = true;
    }
    else {
      pQVar29 = (this->super_MakefileGenerator).project;
      pPStackY_5c0 = (ProString *)0x25491a;
      ProKey::ProKey(&local_118,"QMAKE_APP_FLAG");
      pPStackY_5c0 = (ProString *)0x254925;
      pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,&local_118);
      bVar2 = true;
      bVar4 = false;
      bVar5 = true;
      bVar6 = true;
      bVar3 = false;
      bVar1 = false;
      bVar37 = true;
      bVar16 = true;
      bVar36 = false;
      bVar14 = true;
      bVar15 = true;
      if ((pPVar21->super_QList<ProString>).d.size == 0) goto LAB_00252628;
    }
  }
  if ((bVar1) && (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0))
  {
    LOCK();
    ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x252699;
      QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  cVar17 = (char)iVar31;
  if ((bVar2) && (&(local_118.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0))
  {
    LOCK();
    ((local_118.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_118.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x2526d1;
      QArrayData::deallocate(&(local_118.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (!bVar3 && local_5a0 != (QArrayData *)0x0) {
    LOCK();
    (local_5a0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_5a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_5a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x2526f5;
      QArrayData::deallocate(local_5a0,2,0x10);
    }
  }
  if (!bVar4 && local_598 != (QArrayData *)0x0) {
    LOCK();
    (local_598->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_598->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_598->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x252719;
      QArrayData::deallocate(local_598,2,0x10);
    }
  }
  this_03 = pMVar35;
  if ((bVar5) && (&(local_e8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0))
  {
    LOCK();
    ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x25274c;
      QArrayData::deallocate(&(local_e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((bVar6) && (&(local_b8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0))
  {
    LOCK();
    ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x25277a;
      QArrayData::deallocate(&(local_b8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((cVar17 != '\0') &&
     (&(local_88.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x2527a8;
      QArrayData::deallocate(&(local_88.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x2527d1;
      QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
    }
  }
  if (bVar37) {
    local_168 = (QArrayData *)0x0;
    pvStack_160 = (void *)0x0;
    local_158 = (Data *)0x0;
    local_178 = 0xaaaaaaaa;
    uStack_174 = 0xaaaaaaaa;
    uStack_170 = 0xaaaaaaaa;
    uStack_16c = 0xaaaaaaaa;
    pPStackY_5c0 = (ProString *)0x25280b;
    QTextStream::QTextStream((QTextStream *)&local_178,&local_168,2);
    local_198.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_198.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_198.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar29 = pMVar35->project;
    pPStackY_5c0 = (ProString *)0x252849;
    ProKey::ProKey((ProKey *)&local_438,"VERSION");
    pPStackY_5c0 = (ProString *)0x25285f;
    QMakeEvaluator::first
              ((ProString *)local_3c8,&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
    pPStackY_5c0 = (ProString *)0x252872;
    ProString::toQString((QString *)local_4e8,(ProString *)local_3c8);
    pPStackY_5c0 = (ProString *)0x25288e;
    QVar39.m_data = (storage_type *)0x1;
    QVar39.m_size = (qsizetype)(local_4e8 + 0x40);
    QString::fromUtf8(QVar39);
    local_2c8.m_string.d.d = local_4a8.a.a.m_string.d.d;
    local_2c8.m_string.d.ptr = local_4a8.a.a.m_string.d.ptr;
    local_2c8.m_string.d.size = local_4a8.a.a.m_string.d.size;
    pPStackY_5c0 = (ProString *)0x2528c1;
    QString::split(&local_198,(QString *)local_4e8,&local_2c8,1,1);
    if (&(local_2c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_5c0 = (ProString *)0x2528e6;
        QArrayData::deallocate(&(local_2c8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_4e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x25290f;
        QArrayData::deallocate((QArrayData *)local_4e8._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x252938;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x252961;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((int)local_198.size < 4) {
      iVar31 = (int)local_198.size + -4;
      do {
        pPStackY_5c0 = (ProString *)0x2529a3;
        QVar40.m_data = (storage_type *)0x1;
        QVar40.m_size = (qsizetype)local_3c8;
        QString::fromUtf8(QVar40);
        local_438.a.a.m_string.d.d = (Data *)local_3c8._0_8_;
        local_438.a.a.m_string.d.ptr = (char16_t *)local_3c8._8_8_;
        local_438.a.a.m_string.d.size = local_3c8._16_8_;
        pPStackY_5c0 = (ProString *)0x2529d6;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_198,local_198.size,(QString *)&local_438);
        pPStackY_5c0 = (ProString *)0x2529de;
        QList<QString>::end((QList<QString> *)&local_198);
        if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            pPStackY_5c0 = (ProString *)0x252a07;
            QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        iVar31 = iVar31 + 1;
      } while (iVar31 != 0);
    }
    local_1a8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_1b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pDStack_1b0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_3c8._0_2_ = 0x2e;
    pPStackY_5c0 = (ProString *)0x252a4a;
    QtPrivate::QStringList_join((QList *)&local_1b8,(QChar *)&local_198,(longlong)local_3c8);
    local_1d8.d = (Data *)0x0;
    local_1d8.ptr = (QString *)0x0;
    local_1d8.size = 0;
    local_1f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_1f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_1f8.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x252a9b;
    pMVar56 = this_03;
    ProKey::ProKey((ProKey *)local_3c8,"RC_ICONS");
    pPStackY_5c0 = (ProString *)0x252aa6;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    local_1f8.d = (pPVar21->super_QList<ProString>).d.d;
    local_1f8.ptr = (pPVar21->super_QList<ProString>).d.ptr;
    local_1f8.size = (pPVar21->super_QList<ProString>).d.size;
    if (local_1f8.d != (Data *)0x0) {
      LOCK();
      ((local_1f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x252afa;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x252b0f;
    QList<QString>::reserve((QList<QString> *)&local_1d8,local_1f8.size);
    if (local_1f8.size != 0) {
      lVar34 = local_1f8.size * 0x30;
      pPVar28 = local_1f8.ptr;
      do {
        pPStackY_5c0 = (ProString *)0x252b53;
        ProString::toQString((QString *)&local_438,pPVar28);
        pPStackY_5c0 = (ProString *)0x252b6c;
        MakefileGenerator::fileFixify
                  ((QString *)local_3c8,this_03,(QString *)&local_438,(FileFixifyTypes)0x4,true);
        pPStackY_5c0 = (ProString *)0x252b7f;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_1d8,local_1d8.size,(QString *)local_3c8);
        pPStackY_5c0 = (ProString *)0x252b87;
        QList<QString>::end((QList<QString> *)&local_1d8);
        if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            pPStackY_5c0 = (ProString *)0x252bb0;
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
        if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            pPStackY_5c0 = (ProString *)0x252bd9;
            QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pPVar28 = pPVar28 + 1;
        lVar34 = lVar34 + -0x30;
      } while (lVar34 != 0);
    }
    local_218 = (QArrayData *)0x0;
    pDStack_210 = (Data *)0x0;
    local_208 = (Data *)0x0;
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x252c1c;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_COMPANY");
    pPStackY_5c0 = (ProString *)0x252c27;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    lVar34 = (pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x252c4f;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (lVar34 != 0) {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x252c76;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_COMPANY");
      pPStackY_5c0 = (ProString *)0x252c81;
      pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPStackY_5c0 = (ProString *)0x252c99;
      ProStringList::join((QString *)&local_438,pPVar21,(QChar)0x20);
      pDVar13 = pDStack_210;
      pQVar7 = local_218;
      qVar10 = local_438.a.a.m_string.d.size;
      pDVar8 = local_438.a.a.m_string.d.d;
      local_438.a.a.m_string.d.d = (Data *)local_218;
      local_218 = &pDVar8->super_QArrayData;
      pDStack_210 = (Data *)local_438.a.a.m_string.d.ptr;
      local_438.a.a.m_string.d.ptr = (char16_t *)pDVar13;
      local_438.a.a.m_string.d.size = (qsizetype)local_208;
      local_208 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x252ce8;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x252d11;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
    }
    local_238 = (QArrayData *)0x0;
    pDStack_230 = (Data *)0x0;
    local_228 = (Data *)0x0;
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x252d46;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_DESCRIPTION");
    pPStackY_5c0 = (ProString *)0x252d51;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    lVar34 = (pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x252d79;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (lVar34 != 0) {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x252da0;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_DESCRIPTION");
      pPStackY_5c0 = (ProString *)0x252dab;
      pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPStackY_5c0 = (ProString *)0x252dc3;
      ProStringList::join((QString *)&local_438,pPVar21,(QChar)0x20);
      pDVar13 = pDStack_230;
      pQVar7 = local_238;
      qVar10 = local_438.a.a.m_string.d.size;
      pDVar8 = local_438.a.a.m_string.d.d;
      local_438.a.a.m_string.d.d = (Data *)local_238;
      local_238 = &pDVar8->super_QArrayData;
      pDStack_230 = (Data *)local_438.a.a.m_string.d.ptr;
      local_438.a.a.m_string.d.ptr = (char16_t *)pDVar13;
      local_438.a.a.m_string.d.size = (qsizetype)local_228;
      local_228 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x252e12;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x252e3b;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
    }
    local_258 = (QArrayData *)0x0;
    pDStack_250 = (Data *)0x0;
    local_248 = (Data *)0x0;
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x252e70;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_COPYRIGHT");
    pPStackY_5c0 = (ProString *)0x252e7b;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    lVar34 = (pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x252ea3;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (lVar34 != 0) {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x252eca;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_COPYRIGHT");
      pPStackY_5c0 = (ProString *)0x252ed5;
      pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPStackY_5c0 = (ProString *)0x252eed;
      ProStringList::join((QString *)&local_438,pPVar21,(QChar)0x20);
      pDVar13 = pDStack_250;
      pQVar7 = local_258;
      qVar10 = local_438.a.a.m_string.d.size;
      pDVar8 = local_438.a.a.m_string.d.d;
      local_438.a.a.m_string.d.d = (Data *)local_258;
      local_258 = &pDVar8->super_QArrayData;
      pDStack_250 = (Data *)local_438.a.a.m_string.d.ptr;
      local_438.a.a.m_string.d.ptr = (char16_t *)pDVar13;
      local_438.a.a.m_string.d.size = (qsizetype)local_248;
      local_248 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x252f3c;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x252f65;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
    }
    local_278 = (QArrayData *)0x0;
    pDStack_270 = (Data *)0x0;
    local_268 = (Data *)0x0;
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x252f9a;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_PRODUCT");
    pPStackY_5c0 = (ProString *)0x252fa5;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    lVar34 = (pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x252fcd;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (lVar34 == 0) {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x2530ab;
      ProKey::ProKey((ProKey *)&local_438,"TARGET");
      pPStackY_5c0 = (ProString *)0x2530c1;
      QMakeEvaluator::first
                ((ProString *)local_3c8,&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
      pPStackY_5c0 = (ProString *)0x2530d4;
      ProString::toQString((QString *)(local_4e8 + 0x40),(ProString *)local_3c8);
      pDVar13 = pDStack_270;
      pQVar7 = local_278;
      qVar10 = local_4a8.a.a.m_string.d.size;
      pDVar8 = local_4a8.a.a.m_string.d.d;
      local_4a8.a.a.m_string.d.d = (Data *)local_278;
      local_278 = &pDVar8->super_QArrayData;
      pDStack_270 = (Data *)local_4a8.a.a.m_string.d.ptr;
      local_4a8.a.a.m_string.d.ptr = (char16_t *)pDVar13;
      local_4a8.a.a.m_string.d.size = (qsizetype)local_268;
      local_268 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253123;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x25314c;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        iVar31 = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar7 = &(local_438.a.a.m_string.d.d)->super_QArrayData;
        goto joined_r0x0025315c;
      }
    }
    else {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x252ff4;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_PRODUCT");
      pPStackY_5c0 = (ProString *)0x252fff;
      pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPStackY_5c0 = (ProString *)0x253017;
      ProStringList::join((QString *)&local_438,pPVar21,(QChar)0x20);
      pDVar13 = pDStack_270;
      pQVar7 = local_278;
      qVar10 = local_438.a.a.m_string.d.size;
      pDVar8 = local_438.a.a.m_string.d.d;
      local_438.a.a.m_string.d.d = (Data *)local_278;
      local_278 = &pDVar8->super_QArrayData;
      pDStack_270 = (Data *)local_438.a.a.m_string.d.ptr;
      local_438.a.a.m_string.d.ptr = (char16_t *)pDVar13;
      local_438.a.a.m_string.d.size = (qsizetype)local_268;
      local_268 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253066;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        iVar31 = (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar7 = (QArrayData *)local_3c8._0_8_;
joined_r0x0025315c:
        if (iVar31 == 0) {
          pPStackY_5c0 = (ProString *)0x253175;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
    }
    local_298 = (QArrayData *)0x0;
    pDStack_290 = (Data *)0x0;
    local_288 = (Data *)0x0;
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x2531aa;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_ORIGINAL_FILENAME");
    pPStackY_5c0 = (ProString *)0x2531b5;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    lVar34 = (pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2531dd;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (lVar34 == 0) {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x2532bb;
      ProKey::ProKey((ProKey *)(local_4e8 + 0x40),"TARGET");
      pPStackY_5c0 = (ProString *)0x2532d1;
      QMakeEvaluator::first
                ((ProString *)&local_438,&pQVar29->super_QMakeEvaluator,(ProKey *)(local_4e8 + 0x40)
                );
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x2532ef;
      ProKey::ProKey((ProKey *)&local_2c8,"TARGET_EXT");
      pPStackY_5c0 = (ProString *)0x253305;
      QMakeEvaluator::first
                ((ProString *)local_4e8,&pQVar29->super_QMakeEvaluator,(ProKey *)&local_2c8);
      pPStackY_5c0 = (ProString *)0x253318;
      ProString::ProString((ProString *)local_3c8,(ProString *)&local_438);
      pPStackY_5c0 = (ProString *)0x253328;
      ProString::ProString((ProString *)(local_3c8 + 0x30),(ProString *)local_4e8);
      pPStackY_5c0 = (ProString *)0x25333b;
      QStringBuilder<ProString,_ProString>::convertTo<QString>
                ((QString *)&local_518,(QStringBuilder<ProString,_ProString> *)local_3c8);
      pDVar13 = pDStack_290;
      pQVar7 = local_298;
      qVar10 = local_518.super_ProString.m_string.d.size;
      pDVar8 = local_518.super_ProString.m_string.d.d;
      local_518.super_ProString.m_string.d.d = (Data *)local_298;
      local_298 = &pDVar8->super_QArrayData;
      pDStack_290 = (Data *)local_518.super_ProString.m_string.d.ptr;
      local_518.super_ProString.m_string.d.ptr = (char16_t *)pDVar13;
      local_518.super_ProString.m_string.d.size = (qsizetype)local_288;
      local_288 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x25338c;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      pPStackY_5c0 = (ProString *)0x253399;
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)local_3c8);
      if ((QArrayData *)local_4e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x2533c2;
          QArrayData::deallocate((QArrayData *)local_4e8._0_8_,2,0x10);
        }
      }
      if (&(local_2c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          pPStackY_5c0 = (ProString *)0x2533eb;
          QArrayData::deallocate(&(local_2c8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253414;
          QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        iVar31 = ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar7 = &(local_4a8.a.a.m_string.d.d)->super_QArrayData;
        goto joined_r0x00253424;
      }
    }
    else {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x253204;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_ORIGINAL_FILENAME");
      pPStackY_5c0 = (ProString *)0x25320f;
      pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPStackY_5c0 = (ProString *)0x253227;
      ProStringList::join((QString *)&local_438,pPVar21,(QChar)0x20);
      pDVar13 = pDStack_290;
      pQVar7 = local_298;
      qVar10 = local_438.a.a.m_string.d.size;
      pDVar8 = local_438.a.a.m_string.d.d;
      local_438.a.a.m_string.d.d = (Data *)local_298;
      local_298 = &pDVar8->super_QArrayData;
      pDStack_290 = (Data *)local_438.a.a.m_string.d.ptr;
      local_438.a.a.m_string.d.ptr = (char16_t *)pDVar13;
      local_438.a.a.m_string.d.size = (qsizetype)local_288;
      local_288 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253276;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        iVar31 = (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar7 = (QArrayData *)local_3c8._0_8_;
joined_r0x00253424:
        if (iVar31 == 0) {
          pPStackY_5c0 = (ProString *)0x25343d;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
    }
    local_2e8 = (QArrayData *)0x0;
    pDStack_2e0 = (Data *)0x0;
    local_2d8 = (Data *)0x0;
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x253472;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_INTERNALNAME");
    pPStackY_5c0 = (ProString *)0x25347d;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    lVar34 = (pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2534a5;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (lVar34 != 0) {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x2534cc;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_INTERNALNAME");
      pPStackY_5c0 = (ProString *)0x2534d7;
      pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPStackY_5c0 = (ProString *)0x2534ef;
      ProStringList::join((QString *)&local_438,pPVar21,(QChar)0x20);
      pDVar13 = pDStack_2e0;
      pQVar7 = local_2e8;
      qVar10 = local_438.a.a.m_string.d.size;
      pDVar8 = local_438.a.a.m_string.d.d;
      local_438.a.a.m_string.d.d = (Data *)local_2e8;
      local_2e8 = &pDVar8->super_QArrayData;
      pDStack_2e0 = (Data *)local_438.a.a.m_string.d.ptr;
      local_438.a.a.m_string.d.ptr = (char16_t *)pDVar13;
      local_438.a.a.m_string.d.size = (qsizetype)local_2d8;
      local_2d8 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x25353e;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253567;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
    }
    local_308 = (QArrayData *)0x0;
    pDStack_300 = (Data *)0x0;
    local_2f8 = (Data *)0x0;
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x25359c;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_COMMENTS");
    pPStackY_5c0 = (ProString *)0x2535a7;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    lVar34 = (pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2535cf;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (lVar34 != 0) {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x2535f6;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_COMMENTS");
      pPStackY_5c0 = (ProString *)0x253601;
      pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPStackY_5c0 = (ProString *)0x253619;
      ProStringList::join((QString *)&local_438,pPVar21,(QChar)0x20);
      pDVar13 = pDStack_300;
      pQVar7 = local_308;
      qVar10 = local_438.a.a.m_string.d.size;
      pDVar8 = local_438.a.a.m_string.d.d;
      local_438.a.a.m_string.d.d = (Data *)local_308;
      local_308 = &pDVar8->super_QArrayData;
      pDStack_300 = (Data *)local_438.a.a.m_string.d.ptr;
      local_438.a.a.m_string.d.ptr = (char16_t *)pDVar13;
      local_438.a.a.m_string.d.size = (qsizetype)local_2f8;
      local_2f8 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253668;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253691;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
    }
    local_328 = (QArrayData *)0x0;
    pDStack_320 = (Data *)0x0;
    local_318 = (Data *)0x0;
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x2536c6;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_TRADEMARKS");
    pPStackY_5c0 = (ProString *)0x2536d1;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    lVar34 = (pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2536f9;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (lVar34 != 0) {
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x253720;
      ProKey::ProKey((ProKey *)local_3c8,"QMAKE_TARGET_TRADEMARKS");
      pPStackY_5c0 = (ProString *)0x25372b;
      pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
      pPStackY_5c0 = (ProString *)0x253743;
      ProStringList::join((QString *)&local_438,pPVar21,(QChar)0x20);
      pDVar13 = pDStack_320;
      pQVar7 = local_328;
      qVar10 = local_438.a.a.m_string.d.size;
      pDVar8 = local_438.a.a.m_string.d.d;
      local_438.a.a.m_string.d.d = (Data *)local_328;
      local_328 = &pDVar8->super_QArrayData;
      pDStack_320 = (Data *)local_438.a.a.m_string.d.ptr;
      local_438.a.a.m_string.d.ptr = (char16_t *)pDVar13;
      local_438.a.a.m_string.d.size = (qsizetype)local_318;
      local_318 = (Data *)qVar10;
      if (pQVar7 != (QArrayData *)0x0) {
        LOCK();
        (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253792;
          QArrayData::deallocate(pQVar7,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x2537bb;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
    }
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x2537d9;
    ProKey::ProKey((ProKey *)&local_438,"RC_LANG");
    pPStackY_5c0 = (ProString *)0x2537ef;
    QMakeEvaluator::first
              ((ProString *)local_3c8,&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
    if (local_3c8._28_4_ == 0) {
LAB_0025381d:
      iVar19 = 0x409;
    }
    else {
      local_4a8.a.a.m_string.d.d = (Data *)CONCAT71(local_4a8.a.a.m_string.d.d._1_7_,0xaa);
      pPStackY_5c0 = (ProString *)0x253813;
      iVar19 = ProString::toInt((ProString *)local_3c8,(bool *)(local_4e8 + 0x40),0);
      if ((char)local_4a8.a.a.m_string.d.d == '\0') goto LAB_0025381d;
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x25384c;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x253875;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x253893;
    ProKey::ProKey((ProKey *)&local_438,"RC_CODEPAGE");
    pPStackY_5c0 = (ProString *)0x2538a9;
    QMakeEvaluator::first
              ((ProString *)local_3c8,&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
    if (local_3c8._28_4_ == 0) {
LAB_002538d8:
      iVar20 = 0x4b0;
    }
    else {
      local_4a8.a.a.m_string.d.d = (Data *)CONCAT71(local_4a8.a.a.m_string.d.d._1_7_,0xaa);
      pPStackY_5c0 = (ProString *)0x2538cd;
      iVar20 = ProString::toInt((ProString *)local_3c8,(bool *)(local_4e8 + 0x40),0);
      if ((char)local_4a8.a.a.m_string.d.d == '\0') goto LAB_002538d8;
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x253909;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x253932;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x253949;
    QTextStream::operator<<((QTextStream *)&local_178,"#include <windows.h>\n");
    pPStackY_5c0 = (ProString *)0x253951;
    Qt::endl((QTextStream *)&local_178);
    if (local_1d8.size != 0) {
      this_03 = pMVar56;
      if (local_1d8.size != 0) {
        lVar34 = 0;
        uVar32 = 0;
        do {
          pPStackY_5c0 = (ProString *)0x2539ad;
          QVar41.m_data = (storage_type *)0x12;
          QVar41.m_size = (qsizetype)local_3c8;
          QString::fromUtf8(QVar41);
          local_4a8.a.a.m_string.d.d = (Data *)local_3c8._0_8_;
          local_4a8.a.a.m_string.d.ptr = (char16_t *)local_3c8._8_8_;
          local_4a8.a.a.m_string.d.size = local_3c8._16_8_;
          uVar32 = uVar32 + 1;
          pPStackY_5c0 = (ProString *)0x2539f1;
          QString::arg_impl((longlong)&local_438,(int)local_4e8 + 0x40,(int)uVar32,(QChar)0x0);
          pPStackY_5c0 = (ProString *)0x2539fe;
          pQVar22 = QList<QString>::data((QList<QString> *)&local_1d8);
          pPStackY_5c0 = (ProString *)0x253a0a;
          cQuoted((QString *)local_4e8,(QString *)((long)&(pQVar22->d).d + lVar34));
          pPStackY_5c0 = (ProString *)0x253a3f;
          QVar42.m_size = (size_t)&local_438;
          QVar42.field_0.m_data_utf8 = local_3c8;
          QString::arg_impl(QVar42,(int)local_4e8._8_8_,(QChar)(char16_t)local_4e8._16_8_);
          pPStackY_5c0 = (ProString *)0x253a4a;
          pQVar23 = (QTextStream *)
                    QTextStream::operator<<((QTextStream *)&local_178,(QString *)local_3c8);
          pPStackY_5c0 = (ProString *)0x253a52;
          Qt::endl(pQVar23);
          if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              pPStackY_5c0 = (ProString *)0x253a7b;
              QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_4e8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              pPStackY_5c0 = (ProString *)0x253aa4;
              QArrayData::deallocate((QArrayData *)local_4e8._0_8_,2,0x10);
            }
          }
          if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              pPStackY_5c0 = (ProString *)0x253acd;
              QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              pPStackY_5c0 = (ProString *)0x253af6;
              QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          lVar34 = lVar34 + 0x18;
        } while (uVar32 < (ulong)local_1d8.size);
      }
      pPStackY_5c0 = (ProString *)0x253b15;
      Qt::endl((QTextStream *)&local_178);
      pMVar56 = this_03;
    }
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      local_4a8.a.a.m_string.d.d = (Data *)0x0;
      local_4a8.a.a.m_string.d.ptr = (char16_t *)0x0;
      local_4a8.a.a.m_string.d.size = 0;
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x253b63;
      ProKey::ProKey((ProKey *)&local_438,"TEMPLATE");
      pPStackY_5c0 = (ProString *)0x253b79;
      QMakeEvaluator::first
                ((ProString *)local_3c8,&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
      pPStackY_5c0 = (ProString *)0x253b88;
      bVar36 = ProString::operator==((ProString *)local_3c8,"lib");
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253bae;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253bd7;
          QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pDVar8 = local_4a8.a.a.m_string.d.d;
      local_4a8.a.a.m_string.d.d = (Data *)0x0;
      if (bVar36) {
        local_4a8.a.a.m_string.d.ptr = L"ISOLATIONAWARE_MANIFEST_RESOURCE_ID";
        local_4a8.a.a.m_string.d.size = 0x23;
      }
      else {
        local_4a8.a.a.m_string.d.ptr = L"CREATEPROCESS_MANIFEST_RESOURCE_ID";
        local_4a8.a.a.m_string.d.size = 0x22;
      }
      if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253c40;
          QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
        }
      }
      pPStackY_5c0 = (ProString *)0x253c58;
      pQVar23 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_178,(QString *)(local_4e8 + 0x40));
      pPStackY_5c0 = (ProString *)0x253c67;
      pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23," RT_MANIFEST \"");
      pPStackY_5c0 = (ProString *)0x253c77;
      pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_58);
      pPStackY_5c0 = (ProString *)0x253c86;
      QTextStream::operator<<(pQVar23,"\"\n");
      if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_5c0 = (ProString *)0x253caa;
          QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    pPStackY_5c0 = (ProString *)0x253cc1;
    QTextStream::operator<<((QTextStream *)&local_178,"VS_VERSION_INFO VERSIONINFO\n");
    pPStackY_5c0 = (ProString *)0x253cd0;
    pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_178,"\tFILEVERSION ");
    local_438.a.a.m_string.d.d = (Data *)local_1b8;
    local_438.a.a.m_string.d.ptr = (char16_t *)pDStack_1b0;
    local_438.a.a.m_string.d.size = (qsizetype)local_1a8;
    if (local_1b8 != (QArrayData *)0x0) {
      LOCK();
      (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pPStackY_5c0 = (ProString *)0x253d17;
    QVar43.m_data = (storage_type *)0x1;
    QVar43.m_size = (qsizetype)local_3c8;
    QString::fromUtf8(QVar43);
    local_4a8.a.a.m_string.d.d = (Data *)local_3c8._0_8_;
    local_4a8.a.a.m_string.d.ptr = (char16_t *)local_3c8._8_8_;
    local_4a8.a.a.m_string.d.size = local_3c8._16_8_;
    pPStackY_5c0 = (ProString *)0x253d4b;
    QVar44.m_data = (storage_type *)0x1;
    QVar44.m_size = (qsizetype)local_3c8;
    QString::fromUtf8(QVar44);
    local_4e8._0_8_ = local_3c8._0_8_;
    local_4e8._8_8_ = local_3c8._8_8_;
    local_4e8._16_8_ = local_3c8._16_8_;
    pPStackY_5c0 = (ProString *)0x253d7d;
    pQVar24 = (QString *)
              QString::replace((QString *)&local_438,(QString *)(local_4e8 + 0x40),
                               (CaseSensitivity)local_4e8);
    pPStackY_5c0 = (ProString *)0x253d88;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,pQVar24);
    pPStackY_5c0 = (ProString *)0x253d90;
    Qt::endl(pQVar23);
    if ((QArrayData *)local_4e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x253db5;
        QArrayData::deallocate((QArrayData *)local_4e8._0_8_,2,0x10);
      }
    }
    if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x253dde;
        QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x253e07;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x253e1b;
    pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_178,"\tPRODUCTVERSION ");
    local_438.a.a.m_string.d.d = (Data *)local_1b8;
    local_438.a.a.m_string.d.ptr = (char16_t *)pDStack_1b0;
    local_438.a.a.m_string.d.size = (qsizetype)local_1a8;
    if (local_1b8 != (QArrayData *)0x0) {
      LOCK();
      (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pPStackY_5c0 = (ProString *)0x253e62;
    QVar45.m_data = (storage_type *)0x1;
    QVar45.m_size = (qsizetype)local_3c8;
    QString::fromUtf8(QVar45);
    local_4a8.a.a.m_string.d.d = (Data *)local_3c8._0_8_;
    local_4a8.a.a.m_string.d.ptr = (char16_t *)local_3c8._8_8_;
    local_4a8.a.a.m_string.d.size = local_3c8._16_8_;
    pPStackY_5c0 = (ProString *)0x253e96;
    QVar46.m_data = (storage_type *)0x1;
    QVar46.m_size = (qsizetype)local_3c8;
    QString::fromUtf8(QVar46);
    local_4e8._0_8_ = local_3c8._0_8_;
    local_4e8._8_8_ = local_3c8._8_8_;
    local_4e8._16_8_ = local_3c8._16_8_;
    pPStackY_5c0 = (ProString *)0x253ec8;
    pQVar24 = (QString *)
              QString::replace((QString *)&local_438,(QString *)(local_4e8 + 0x40),
                               (CaseSensitivity)local_4e8);
    pPStackY_5c0 = (ProString *)0x253ed3;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,pQVar24);
    pPStackY_5c0 = (ProString *)0x253edb;
    Qt::endl(pQVar23);
    if ((QArrayData *)local_4e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x253f00;
        QArrayData::deallocate((QArrayData *)local_4e8._0_8_,2,0x10);
      }
    }
    if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x253f29;
        QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x253f52;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x253f69;
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILEFLAGSMASK 0x3fL\n");
    pPStackY_5c0 = (ProString *)0x253f78;
    QTextStream::operator<<((QTextStream *)&local_178,"#ifdef _DEBUG\n");
    pPStackY_5c0 = (ProString *)0x253f87;
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILEFLAGS VS_FF_DEBUG\n");
    pPStackY_5c0 = (ProString *)0x253f96;
    QTextStream::operator<<((QTextStream *)&local_178,"#else\n");
    pPStackY_5c0 = (ProString *)0x253fa5;
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILEFLAGS 0x0L\n");
    pPStackY_5c0 = (ProString *)0x253fb4;
    QTextStream::operator<<((QTextStream *)&local_178,"#endif\n");
    pPStackY_5c0 = (ProString *)0x253fc3;
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILEOS VOS_NT_WINDOWS32\n");
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x253fe6;
    QVar47.m_data = (storage_type *)0x6;
    QVar47.m_size = (qsizetype)local_3c8;
    QString::fromUtf8(QVar47);
    uVar12 = local_3c8._0_8_;
    pPStackY_5c0 = (ProString *)0x253ffb;
    config_00.m_data = (storage_type_conflict *)local_3c8._8_8_;
    config_00.m_size = local_3c8._16_8_;
    bVar36 = QMakeEvaluator::isActiveConfig(&pQVar29->super_QMakeEvaluator,config_00,false);
    if ((QArrayData *)uVar12 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254019;
        QArrayData::deallocate((QArrayData *)uVar12,2,0x10);
      }
    }
    pcVar33 = "\tFILETYPE VFT_APP\n";
    if (bVar36) {
      pcVar33 = "\tFILETYPE VFT_DLL\n";
    }
    pPStackY_5c0 = (ProString *)0x25403e;
    QTextStream::operator<<((QTextStream *)&local_178,pcVar33);
    pPStackY_5c0 = (ProString *)0x25404d;
    QTextStream::operator<<((QTextStream *)&local_178,"\tFILESUBTYPE VFT2_UNKNOWN\n");
    pPStackY_5c0 = (ProString *)0x25405c;
    QTextStream::operator<<((QTextStream *)&local_178,"\tBEGIN\n");
    pPStackY_5c0 = (ProString *)0x25406b;
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tBLOCK \"StringFileInfo\"\n");
    pPStackY_5c0 = (ProString *)0x25407a;
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tBEGIN\n");
    pPStackY_5c0 = (ProString *)0x254089;
    pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_178,"\t\t\tBLOCK \"");
    pPStackY_5c0 = (ProString *)0x2540a8;
    QVar48.m_data = (storage_type *)0x4;
    QVar48.m_size = (qsizetype)local_3c8;
    QString::fromUtf8(QVar48);
    local_4a8.a.a.m_string.d.d = (Data *)local_3c8._0_8_;
    local_4a8.a.a.m_string.d.ptr = (char16_t *)local_3c8._8_8_;
    local_4a8.a.a.m_string.d.size = local_3c8._16_8_;
    pPStackY_5c0 = (ProString *)0x2540e6;
    QString::arg_impl((longlong)&local_438,(int)local_4e8 + 0x40,iVar19,(QChar)0x4);
    pPStackY_5c0 = (ProString *)0x254112;
    iVar31 = iVar20;
    QString::arg_impl((longlong)local_3c8,(int)&local_438,iVar20,(QChar)0x4);
    pPStackY_5c0 = (ProString *)0x25411d;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)local_3c8);
    pPStackY_5c0 = (ProString *)0x25412c;
    QTextStream::operator<<(pQVar23,"\"\n");
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254151;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    pMVar35 = pMVar56;
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x25417f;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2541a8;
        QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x2541bf;
    QTextStream::operator<<((QTextStream *)&local_178,"\t\t\tBEGIN\n");
    pPStackY_5c0 = (ProString *)0x2541ce;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_178,"\t\t\t\tVALUE \"CompanyName\", \"")
    ;
    pPStackY_5c0 = (ProString *)0x2541de;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_218);
    pPStackY_5c0 = (ProString *)0x2541f0;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x2541ff;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_178,"\t\t\t\tVALUE \"FileDescription\", \"");
    pPStackY_5c0 = (ProString *)0x25420f;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_238);
    pPStackY_5c0 = (ProString *)0x25421a;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x254229;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_178,"\t\t\t\tVALUE \"FileVersion\", \"")
    ;
    pPStackY_5c0 = (ProString *)0x25423c;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_1b8);
    pPStackY_5c0 = (ProString *)0x254247;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x254256;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_178,"\t\t\t\tVALUE \"LegalCopyright\", \"");
    pPStackY_5c0 = (ProString *)0x254266;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_258);
    pPStackY_5c0 = (ProString *)0x254271;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x254280;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_178,"\t\t\t\tVALUE \"OriginalFilename\", \"");
    pPStackY_5c0 = (ProString *)0x254290;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_298);
    pPStackY_5c0 = (ProString *)0x25429b;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x2542aa;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_178,"\t\t\t\tVALUE \"ProductName\", \"")
    ;
    pPStackY_5c0 = (ProString *)0x2542ba;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_278);
    pPStackY_5c0 = (ProString *)0x2542c5;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x2542d4;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_178,"\t\t\t\tVALUE \"ProductVersion\", \"");
    pPStackY_5c0 = (ProString *)0x2542df;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_1b8);
    pPStackY_5c0 = (ProString *)0x2542ea;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x2542f9;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_178,"\t\t\t\tVALUE \"InternalName\", \"");
    pPStackY_5c0 = (ProString *)0x254309;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_2e8);
    pPStackY_5c0 = (ProString *)0x254314;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x254323;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_178,"\t\t\t\tVALUE \"Comments\", \"");
    pPStackY_5c0 = (ProString *)0x254333;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_308);
    pPStackY_5c0 = (ProString *)0x25433e;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x25434d;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<
                        ((QTextStream *)&local_178,"\t\t\t\tVALUE \"LegalTrademarks\", \"");
    pPStackY_5c0 = (ProString *)0x25435d;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_328);
    pPStackY_5c0 = (ProString *)0x254368;
    QTextStream::operator<<(pQVar23,"\\0\"\n");
    pPStackY_5c0 = (ProString *)0x254377;
    QTextStream::operator<<((QTextStream *)&local_178,"\t\t\tEND\n");
    pPStackY_5c0 = (ProString *)0x254386;
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tEND\n");
    pPStackY_5c0 = (ProString *)0x254395;
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tBLOCK \"VarFileInfo\"\n");
    pPStackY_5c0 = (ProString *)0x2543a4;
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tBEGIN\n");
    pPStackY_5c0 = (ProString *)0x2543b3;
    pQVar23 = (QTextStream *)
              QTextStream::operator<<((QTextStream *)&local_178,"\t\t\tVALUE \"Translation\", ");
    pPStackY_5c0 = (ProString *)0x2543d2;
    QVar49.m_data = (storage_type *)0x4;
    QVar49.m_size = (qsizetype)local_3c8;
    QString::fromUtf8(QVar49);
    local_4a8.a.a.m_string.d.d = (Data *)local_3c8._0_8_;
    local_4a8.a.a.m_string.d.ptr = (char16_t *)local_3c8._8_8_;
    local_4a8.a.a.m_string.d.size = local_3c8._16_8_;
    pPStackY_5c0 = (ProString *)0x25440f;
    QString::arg_impl((longlong)&local_438,(int)local_4e8 + 0x40,iVar19,(QChar)0x4);
    pPStackY_5c0 = (ProString *)0x25441a;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_438);
    pPStackY_5c0 = (ProString *)0x254429;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,", ");
    pPStackY_5c0 = (ProString *)0x254448;
    QVar50.m_data = (storage_type *)0x2;
    QVar50.m_size = (qsizetype)local_3c8;
    QString::fromUtf8(QVar50);
    local_4e8._0_8_ = local_3c8._0_8_;
    local_4e8._8_8_ = local_3c8._8_8_;
    local_4e8._16_8_ = local_3c8._16_8_;
    pPStackY_5c0 = (ProString *)0x254483;
    QString::arg_impl((longlong)local_3c8,(int)local_4e8,iVar20,(QChar)0x4);
    pPStackY_5c0 = (ProString *)0x25448e;
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)local_3c8);
    pPStackY_5c0 = (ProString *)0x254496;
    Qt::endl(pQVar23);
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2544ba;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_4e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2544e3;
        QArrayData::deallocate((QArrayData *)local_4e8._0_8_,2,0x10);
      }
    }
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x25450c;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254535;
        QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x25454c;
    QTextStream::operator<<((QTextStream *)&local_178,"\t\tEND\n");
    pPStackY_5c0 = (ProString *)0x25455b;
    QTextStream::operator<<((QTextStream *)&local_178,"\tEND\n");
    pPStackY_5c0 = (ProString *)0x25456a;
    QTextStream::operator<<((QTextStream *)&local_178,"/* End of Version info */\n");
    pPStackY_5c0 = (ProString *)0x254572;
    Qt::endl((QTextStream *)&local_178);
    pPStackY_5c0 = (ProString *)0x25457a;
    QTextStream::flush();
    local_348.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_348.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_348.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar29 = pMVar56->project;
    pPStackY_5c0 = (ProString *)0x2545b8;
    ProKey::ProKey(&local_518,"OUT_PWD");
    pPStackY_5c0 = (ProString *)0x2545ce;
    QMakeEvaluator::first(&local_2c8,&pQVar29->super_QMakeEvaluator,&local_518);
    pPStackY_5c0 = (ProString *)0x2545e1;
    ProString::ProString((ProString *)local_4e8,&local_2c8);
    local_4e8._48_8_ = "/";
    pQVar29 = pMVar56->project;
    pPStackY_5c0 = (ProString *)0x254607;
    ProKey::ProKey(&local_578,"TARGET");
    pPStackY_5c0 = (ProString *)0x25461a;
    QMakeEvaluator::first(&local_548,&pQVar29->super_QMakeEvaluator,&local_578);
    this_00 = (QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
              (local_4e8 + 0x40);
    pPStackY_5c0 = (ProString *)0x25462d;
    ProString::ProString((ProString *)this_00,(ProString *)local_4e8);
    local_4a8.a.b = (char (*) [2])local_4e8._48_8_;
    pPStackY_5c0 = (ProString *)0x254648;
    ProString::ProString(&local_4a8.b,&local_548);
    pPStackY_5c0 = (ProString *)0x25465b;
    ProString::ProString((ProString *)&local_438,(ProString *)this_00);
    local_438.a.b = local_4a8.a.b;
    pPStackY_5c0 = (ProString *)0x254677;
    ProString::ProString(&local_438.b,&local_4a8.b);
    local_3d0 = (char (*) [10])0x2b17de;
    pPStackY_5c0 = (ProString *)0x254695;
    ProString::ProString((ProString *)local_3c8,(ProString *)&local_438);
    local_3c8._48_8_ = local_438.a.b;
    pPStackY_5c0 = (ProString *)0x2546b0;
    ProString::ProString(&local_390,&local_438.b);
    local_360 = local_3d0;
    local_358 = (char (*) [4])0x2ae001;
    pPStackY_5c0 = (ProString *)0x2546d3;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>,_const_char_(&)[4]>
    ::convertTo<QString>
              (&local_348,
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>,_const_char_(&)[10]>,_const_char_(&)[4]>
                *)local_3c8);
    pPStackY_5c0 = (ProString *)0x2546db;
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)local_3c8)
    ;
    pPStackY_5c0 = (ProString *)0x2546e3;
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              (&local_438);
    pPStackY_5c0 = (ProString *)0x2546eb;
    QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
              (this_00);
    if (&(local_548.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_548.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_548.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_548.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_5c0 = (ProString *)0x25470c;
        QArrayData::deallocate(&(local_548.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_578.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_578.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_578.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_578.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x25472f;
        QArrayData::deallocate(&(local_578.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    this_03 = pMVar35;
    if ((QArrayData *)local_4e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x25475d;
        QArrayData::deallocate((QArrayData *)local_4e8._0_8_,2,0x10);
      }
    }
    if (&(local_2c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_5c0 = (ProString *)0x254786;
        QArrayData::deallocate(&(local_2c8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_518.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_518.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_518.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_518.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2547af;
        QArrayData::deallocate(&(local_518.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    this_02 = (QFile *)local_4e8;
    local_4e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_4e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pPVar28 = (ProString *)local_3c8;
    pPStackY_5c0 = (ProString *)0x2547d9;
    QDir::cleanPath((QString *)pPVar28);
    pPStackY_5c0 = (ProString *)0x2547e4;
    QFile::QFile(this_02,(QString *)pPVar28);
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254808;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x254815;
    cVar17 = QFile::exists();
    if (cVar17 == '\0') {
LAB_0025498d:
      this_04 = (ProString *)0x2;
      pPStackY_5c0 = (ProString *)0x25499f;
      cVar17 = QFile::open(local_4e8);
      if (cVar17 == '\0') {
        local_3c8._0_8_ = (QArrayData *)0x0;
        local_3c8._8_8_ = (Data *)0x0;
        local_3c8._16_8_ = (Data *)0x0;
        this_02 = (QFile *)(local_4e8 + 0x40);
        pPStackY_5c0 = (ProString *)0x2549cd;
        QDir::QDir((QDir *)this_02,(QString *)local_3c8);
        pPVar28 = &local_2c8;
        pPStackY_5c0 = (ProString *)0x2549e5;
        QFileInfo::QFileInfo((QFileInfo *)pPVar28,(QFileDevice *)local_4e8);
        pPStackY_5c0 = (ProString *)0x2549f8;
        QFileInfo::path();
        pPStackY_5c0 = (ProString *)0x254a05;
        QDir::mkpath(this_02,&local_438,0);
        if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            pPStackY_5c0 = (ProString *)0x254a29;
            QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pPStackY_5c0 = (ProString *)0x254a36;
        QFileInfo::~QFileInfo((QFileInfo *)&local_2c8);
        pPStackY_5c0 = (ProString *)0x254a43;
        QDir::~QDir((QDir *)(local_4e8 + 0x40));
        if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            pPStackY_5c0 = (ProString *)0x254a6c;
            QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
          }
        }
        this_04 = (ProString *)0x2;
        pPStackY_5c0 = (ProString *)0x254a7e;
        cVar17 = QFile::open(local_4e8);
      }
      if (cVar17 == '\0') goto LAB_00255894;
      pPStackY_5c0 = (ProString *)0x254a9e;
      QIODevice::write((QByteArray *)local_4e8);
      pPStackY_5c0 = (ProString *)0x254aa6;
      QFileDevice::close();
    }
    else {
      pPStackY_5c0 = (ProString *)0x25482f;
      cVar17 = QFile::open(local_4e8,1);
      if (cVar17 == '\0') goto LAB_0025498d;
      pPStackY_5c0 = (ProString *)0x25484f;
      QIODevice::readAll();
      uVar30 = (undefined7)((ulong)local_3c8 >> 8);
      this_02 = (QFile *)CONCAT71(uVar30,1);
      if ((Data *)local_3c8._16_8_ == local_158) {
        if ((Data *)local_3c8._16_8_ == (Data *)0x0) {
          this_02 = (QFile *)0x0;
        }
        else {
          pPStackY_5c0 = (ProString *)0x254881;
          iVar19 = bcmp((void *)local_3c8._8_8_,pvStack_160,local_3c8._16_8_);
          this_02 = (QFile *)CONCAT71(uVar30,iVar19 != 0);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x254978;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,1,0x10);
        }
      }
      pPStackY_5c0 = (ProString *)0x254985;
      QFileDevice::close();
      if ((char)this_02 != '\0') goto LAB_0025498d;
    }
    pQVar29 = pMVar35->project;
    pPStackY_5c0 = (ProString *)0x254ac4;
    ProKey::ProKey((ProKey *)local_3c8,"QMAKE_WRITE_DEFAULT_RC");
    pPStackY_5c0 = (ProString *)0x254acf;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    lVar34 = (pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254af7;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (lVar34 == 0) {
      pQVar29 = pMVar35->project;
      pPStackY_5c0 = (ProString *)0x2557b9;
      ProKey::ProKey((ProKey *)local_3c8,"RC_FILE");
      pPStackY_5c0 = (ProString *)0x2557c4;
      pQVar25 = &QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8)->
                 super_QList<ProString>;
      pPStackY_5c0 = (ProString *)0x2557df;
      QFile::fileName();
      pPStackY_5c0 = (ProString *)0x2557f2;
      ProString::ProString((ProString *)&local_438,(QString *)(local_4e8 + 0x40));
      pPStackY_5c0 = (ProString *)0x2557ff;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar25,0,(ProString *)&local_438);
      pPStackY_5c0 = (ProString *)0x255807;
      QList<ProString>::begin(pQVar25);
      if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_5c0 = (ProString *)0x25582b;
          QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_5c0 = (ProString *)0x255854;
          QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x255885;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
    }
    pPStackY_5c0 = (ProString *)0x254b0d;
    QFile::~QFile((QFile *)local_4e8);
    if (&(local_348.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_348.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_348.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_348.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254b36;
        QArrayData::deallocate(&(local_348.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_328 != (QArrayData *)0x0) {
      LOCK();
      (local_328->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_328->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_328->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254b5f;
        QArrayData::deallocate(local_328,2,0x10);
      }
    }
    if (local_308 != (QArrayData *)0x0) {
      LOCK();
      (local_308->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_308->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_308->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254b88;
        QArrayData::deallocate(local_308,2,0x10);
      }
    }
    if (local_2e8 != (QArrayData *)0x0) {
      LOCK();
      (local_2e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254bb1;
        QArrayData::deallocate(local_2e8,2,0x10);
      }
    }
    if (local_298 != (QArrayData *)0x0) {
      LOCK();
      (local_298->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_298->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_298->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254bda;
        QArrayData::deallocate(local_298,2,0x10);
      }
    }
    if (local_278 != (QArrayData *)0x0) {
      LOCK();
      (local_278->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_278->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_278->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254c03;
        QArrayData::deallocate(local_278,2,0x10);
      }
    }
    if (local_258 != (QArrayData *)0x0) {
      LOCK();
      (local_258->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_258->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_258->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254c2c;
        QArrayData::deallocate(local_258,2,0x10);
      }
    }
    if (local_238 != (QArrayData *)0x0) {
      LOCK();
      (local_238->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_238->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_238->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254c55;
        QArrayData::deallocate(local_238,2,0x10);
      }
    }
    if (local_218 != (QArrayData *)0x0) {
      LOCK();
      (local_218->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_218->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_218->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254c7e;
        QArrayData::deallocate(local_218,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x254c8b;
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1f8);
    pPStackY_5c0 = (ProString *)0x254c98;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_1d8);
    if (local_1b8 != (QArrayData *)0x0) {
      LOCK();
      (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254cc1;
        QArrayData::deallocate(local_1b8,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x254cce;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_198);
    pPStackY_5c0 = (ProString *)0x254cdb;
    QTextStream::~QTextStream((QTextStream *)&local_178);
    if (local_168 != (QArrayData *)0x0) {
      LOCK();
      (local_168->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_168->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_168->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254d04;
        QArrayData::deallocate(local_168,1,0x10);
      }
    }
  }
  pQVar29 = pMVar35->project;
  pPStackY_5c0 = (ProString *)0x254d22;
  ProKey::ProKey((ProKey *)local_3c8,"RC_FILE");
  pPStackY_5c0 = (ProString *)0x254d2d;
  pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
  lVar34 = (pPVar21->super_QList<ProString>).d.size;
  if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x254d55;
      QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
    }
  }
  if (lVar34 != 0) {
    pQVar29 = pMVar35->project;
    pPVar28 = (ProString *)local_3c8;
    pPStackY_5c0 = (ProString *)0x254d7c;
    ProKey::ProKey((ProKey *)pPVar28,"RES_FILE");
    pPStackY_5c0 = (ProString *)0x254d87;
    this_04 = pPVar28;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)pPVar28);
    this_02 = (QFile *)(pPVar21->super_QList<ProString>).d.size;
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        this_04 = (ProString *)0x2;
        pPStackY_5c0 = (ProString *)0x254daf;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (this_02 != (QFile *)0x0) {
      pPStackY_5c0 = (ProString *)0x255894;
      processRcFileVar();
LAB_00255894:
      this_05 = (ProString *)local_4e8;
      pPStackY_5c0 = (ProString *)0x2558a1;
      processRcFileVar((Win32MakefileGenerator *)this_05);
      lStackY_5d0 = *(long *)(in_FS_OFFSET + 0x28);
      pQStackY_5c8 = this_02;
      pPStackY_5c0 = pPVar28;
      QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>
                (&QStackY_5e8,(QStringBuilder<QLatin1String,_QString_&> *)this_04);
      ProString::ProString(this_05,&QStackY_5e8);
      if (&(QStackY_5e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((QStackY_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((QStackY_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((QStackY_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(QStackY_5e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lStackY_5d0) {
        return;
      }
      __stack_chk_fail();
    }
    local_2c8.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_2c8.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_2c8.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar29 = pMVar35->project;
    pPStackY_5c0 = (ProString *)0x254df6;
    ProKey::ProKey((ProKey *)&local_438,"RC_FILE");
    pPStackY_5c0 = (ProString *)0x254e0c;
    QMakeEvaluator::first
              ((ProString *)local_3c8,&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
    pPStackY_5c0 = (ProString *)0x254e17;
    ProString::toQString(&local_2c8.m_string,(ProString *)local_3c8);
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254e3c;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254e65;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x254e75;
    qmake_getpwd();
    bVar18 = 1;
    if (Option::output_dir.d.size == local_3c8._16_8_) {
      pPStackY_5c0 = (ProString *)0x254e9c;
      QVar52.m_data = Option::output_dir.d.ptr;
      QVar52.m_size = Option::output_dir.d.size;
      QVar55.m_data = (storage_type_conflict *)local_3c8._8_8_;
      QVar55.m_size = local_3c8._16_8_;
      bVar18 = QtPrivate::equalStrings(QVar52,QVar55);
      bVar18 = bVar18 ^ 1;
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x254eca;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (bVar18 != 0) {
      local_4e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pPStackY_5c0 = (ProString *)0x254ef7;
      QFileInfo::QFileInfo((QFileInfo *)local_4e8,(QString *)&local_2c8);
      pPStackY_5c0 = (ProString *)0x254f0a;
      QFileInfo::absoluteFilePath();
      pPStackY_5c0 = (ProString *)0x254f1d;
      ProString::ProString((ProString *)local_3c8,(QString *)(local_4e8 + 0x40));
      pQVar29 = pMVar35->project;
      pPStackY_5c0 = (ProString *)0x254f3b;
      ProKey::ProKey((ProKey *)&local_438,"RC_FILE");
      pPStackY_5c0 = (ProString *)0x254f46;
      pQVar25 = &QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438)->
                 super_QList<ProString>;
      pPStackY_5c0 = (ProString *)0x254f4e;
      iVar26 = QList<ProString>::begin(pQVar25);
      pPStackY_5c0 = (ProString *)0x254f5c;
      QString::operator=(&(iVar26.i)->m_string,(QString *)local_3c8);
      (iVar26.i)->m_hash = local_3c8._40_8_;
      (iVar26.i)->m_offset = local_3c8._24_4_;
      (iVar26.i)->m_length = local_3c8._28_4_;
      *(undefined8 *)&(iVar26.i)->m_file = local_3c8._32_8_;
      if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_5c0 = (ProString *)0x254f91;
          QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x254fba;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
      if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_5c0 = (ProString *)0x254fe3;
          QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pPStackY_5c0 = (ProString *)0x254ff0;
      QFileInfo::~QFileInfo((QFileInfo *)local_4e8);
    }
    pPStackY_5c0 = (ProString *)0x255019;
    QVar53.m_data = (char *)0x3;
    QVar53.m_size = (qsizetype)&local_2c8;
    QString::replace(QVar53,(QString *)0x2ae001,0x2e2c70);
    pQVar29 = pMVar35->project;
    pPStackY_5c0 = (ProString *)0x255037;
    ProKey::ProKey((ProKey *)local_3c8,"RES_FILE");
    pPStackY_5c0 = (ProString *)0x255042;
    this_01 = (QMovableArrayOps<ProString> *)
              QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    pDVar8 = local_2c8.m_string.d.d;
    if (&(local_2c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    pPStackY_5c0 = (ProString *)0x255077;
    file.d.ptr._4_4_ = iVar31;
    file.d._0_12_ = in_stack_fffffffffffffa48;
    file.d.size = (qsizetype)this_03;
    MakefileGenerator::fileInfo((MakefileGenerator *)local_4e8,file);
    pPStackY_5c0 = (ProString *)0x25508a;
    QFileInfo::fileName();
    pPStackY_5c0 = (ProString *)0x25509d;
    ProString::ProString((ProString *)&local_438,(QString *)(local_4e8 + 0x40));
    pPStackY_5c0 = (ProString *)0x2550aa;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>(this_01,0,(ProString *)&local_438);
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2550ce;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2550f7;
        QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x255104;
    QFileInfo::~QFileInfo((QFileInfo *)local_4e8);
    if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x255127;
        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x255150;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    local_518.super_ProString.m_string.d.d = (Data *)0x0;
    local_518.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_518.super_ProString.m_string.d.size = 0;
    pQVar29 = pMVar35->project;
    pPStackY_5c0 = (ProString *)0x25518a;
    QVar54.m_data = (storage_type *)0x9;
    QVar54.m_size = (qsizetype)local_3c8;
    QString::fromUtf8(QVar54);
    uVar12 = local_3c8._0_8_;
    pPStackY_5c0 = (ProString *)0x25519f;
    config_02.m_data = (storage_type_conflict *)local_3c8._8_8_;
    config_02.m_size = local_3c8._16_8_;
    bVar36 = QMakeEvaluator::isActiveConfig(&pQVar29->super_QMakeEvaluator,config_02,false);
    if ((QArrayData *)uVar12 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar12)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2551bd;
        QArrayData::deallocate((QArrayData *)uVar12,2,0x10);
      }
    }
    if (bVar36) {
      pQVar29 = this_03->project;
      pcVar33 = "DESTDIR";
    }
    else {
      pQVar29 = this_03->project;
      pcVar33 = "OBJECTS_DIR";
    }
    pPStackY_5c0 = (ProString *)0x2551fc;
    pMVar35 = this_03;
    ProKey::ProKey((ProKey *)&local_438,pcVar33);
    pPStackY_5c0 = (ProString *)0x255212;
    QMakeEvaluator::first
              ((ProString *)local_3c8,&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
    pPStackY_5c0 = (ProString *)0x255225;
    ProString::toQString((QString *)(local_4e8 + 0x40),(ProString *)local_3c8);
    qVar10 = local_4a8.a.a.m_string.d.size;
    pDVar11 = local_4a8.a.a.m_string.d.d;
    pcVar9 = local_518.super_ProString.m_string.d.ptr;
    pDVar8 = local_518.super_ProString.m_string.d.d;
    local_4a8.a.a.m_string.d.d = local_518.super_ProString.m_string.d.d;
    local_518.super_ProString.m_string.d.d = pDVar11;
    local_518.super_ProString.m_string.d.ptr = local_4a8.a.a.m_string.d.ptr;
    local_4a8.a.a.m_string.d.ptr = pcVar9;
    local_4a8.a.a.m_string.d.size = local_518.super_ProString.m_string.d.size;
    local_518.super_ProString.m_string.d.size = qVar10;
    if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x255274;
        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x25529d;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2552c6;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((Data *)local_518.super_ProString.m_string.d.size != (Data *)0x0) {
      pPStackY_5c0 = (ProString *)0x2552ec;
      QString::append((QString *)&local_518);
      pQVar29 = this_03->project;
      pPStackY_5c0 = (ProString *)0x25530b;
      ProKey::ProKey((ProKey *)local_3c8,"RES_FILE");
      pPStackY_5c0 = (ProString *)0x255316;
      pQVar25 = &QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8)->
                 super_QList<ProString>;
      pPStackY_5c0 = (ProString *)0x25531e;
      iVar26 = QList<ProString>::begin(pQVar25);
      pPStackY_5c0 = (ProString *)0x255334;
      ProString::ProString((ProString *)&local_438,(QString *)&local_518);
      pPStackY_5c0 = (ProString *)0x25533f;
      ProString::prepend(iVar26.i,(ProString *)&local_438);
      if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             = ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          pPStackY_5c0 = (ProString *)0x255363;
          QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          pPStackY_5c0 = (ProString *)0x25538c;
          QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
        }
      }
    }
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x2553ab;
    ProKey::ProKey((ProKey *)(local_4e8 + 0x40),"RES_FILE");
    pPStackY_5c0 = (ProString *)0x2553c1;
    QMakeEvaluator::first
              ((ProString *)&local_438,&pQVar29->super_QMakeEvaluator,(ProKey *)(local_4e8 + 0x40));
    pPStackY_5c0 = (ProString *)0x2553d1;
    ProString::toQString((QString *)&local_578,(ProString *)&local_438);
    local_3c8._0_8_ = local_578.super_ProString.m_string.d.d;
    local_3c8._8_8_ = local_578.super_ProString.m_string.d.ptr;
    local_3c8._16_8_ = local_578.super_ProString.m_string.d.size;
    if (&(local_578.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_578.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_578.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pPStackY_5c0 = (ProString *)0x25540a;
    string.d.ptr._4_4_ = iVar31;
    string.d._0_12_ = in_stack_fffffffffffffa48;
    string.d.size = (qsizetype)pMVar35;
    Option::fixString(&local_548.m_string,string,(uchar)local_3c8);
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x25542e;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    pPStackY_5c0 = (ProString *)0x255443;
    ProString::ProString((ProString *)local_3c8,&local_548.m_string);
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x255462;
    ProKey::ProKey((ProKey *)local_4e8,"RES_FILE");
    pPStackY_5c0 = (ProString *)0x25546d;
    pQVar25 = &QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_4e8)->
               super_QList<ProString>;
    pPStackY_5c0 = (ProString *)0x255475;
    iVar26 = QList<ProString>::begin(pQVar25);
    pPStackY_5c0 = (ProString *)0x255483;
    QString::operator=(&(iVar26.i)->m_string,(QString *)local_3c8);
    (iVar26.i)->m_hash = local_3c8._40_8_;
    (iVar26.i)->m_offset = local_3c8._24_4_;
    (iVar26.i)->m_length = local_3c8._28_4_;
    *(undefined8 *)&(iVar26.i)->m_file = local_3c8._32_8_;
    if ((QArrayData *)local_4e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_4e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2554b8;
        QArrayData::deallocate((QArrayData *)local_4e8._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2554e1;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (&(local_548.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_548.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_548.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_548.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_5c0 = (ProString *)0x255504;
        QArrayData::deallocate(&(local_548.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_578.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_578.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_578.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_578.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x255527;
        QArrayData::deallocate(&(local_578.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x255550;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_4a8.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_4a8.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x255579;
        QArrayData::deallocate(&(local_4a8.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x255598;
    ProKey::ProKey((ProKey *)local_3c8,"RES_FILE");
    pPStackY_5c0 = (ProString *)0x2555a3;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x2555c5;
    ProKey::ProKey((ProKey *)&local_438,"POST_TARGETDEPS");
    pPStackY_5c0 = (ProString *)0x2555d0;
    pPVar27 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
    pPVar28 = (pPVar21->super_QList<ProString>).d.ptr;
    pPStackY_5c0 = (ProString *)0x2555eb;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar27,pPVar28,
               pPVar28 + (pPVar21->super_QList<ProString>).d.size);
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x25560f;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x255638;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x255657;
    ProKey::ProKey((ProKey *)local_3c8,"RES_FILE");
    pPStackY_5c0 = (ProString *)0x255662;
    pPVar21 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)local_3c8);
    pQVar29 = this_03->project;
    pPStackY_5c0 = (ProString *)0x255684;
    ProKey::ProKey((ProKey *)&local_438,"CLEAN_FILES");
    pPStackY_5c0 = (ProString *)0x25568f;
    pPVar27 = QMakeEvaluator::valuesRef(&pQVar29->super_QMakeEvaluator,(ProKey *)&local_438);
    pPVar28 = (pPVar21->super_QList<ProString>).d.ptr;
    pPStackY_5c0 = (ProString *)0x2556aa;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar27,pPVar28,
               pPVar28 + (pPVar21->super_QList<ProString>).d.size);
    if (&(local_438.a.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_438.a.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2556ce;
        QArrayData::deallocate(&(local_438.a.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_3c8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_3c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x2556f7;
        QArrayData::deallocate((QArrayData *)local_3c8._0_8_,2,0x10);
      }
    }
    if (&(local_518.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_518.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_518.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_518.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        pPStackY_5c0 = (ProString *)0x255720;
        QArrayData::deallocate(&(local_518.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_2c8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_2c8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        pPStackY_5c0 = (ProString *)0x255749;
        QArrayData::deallocate(&(local_2c8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      pPStackY_5c0 = (ProString *)0x255772;
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00255772:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  pPStackY_5c0 = (ProString *)0x25588f;
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::processRcFileVar()
{
    if (Option::qmake_mode == Option::QMAKE_GENERATE_NOTHING)
        return;

    const QString manifestFile = project->first("QMAKE_MANIFEST").toQString();
    if (((!project->values("VERSION").isEmpty() || !project->values("RC_ICONS").isEmpty() || !manifestFile.isEmpty())
        && project->values("RC_FILE").isEmpty()
        && project->values("RES_FILE").isEmpty()
        && !project->isActiveConfig("no_generated_target_info")
        && (project->isActiveConfig("shared") || !project->values("QMAKE_APP_FLAG").isEmpty()))
        || !project->values("QMAKE_WRITE_DEFAULT_RC").isEmpty()){

        QByteArray rcString;
        QTextStream ts(&rcString, QFile::WriteOnly);

        QStringList vers = project->first("VERSION").toQString().split(".", Qt::SkipEmptyParts);
        for (int i = vers.size(); i < 4; i++)
            vers += "0";
        QString versionString = vers.join('.');

        QStringList rcIcons;
        const auto icons = project->values("RC_ICONS");
        rcIcons.reserve(icons.size());
        for (const ProString &icon : icons)
            rcIcons.append(fileFixify(icon.toQString(), FileFixifyAbsolute));

        QString companyName;
        if (!project->values("QMAKE_TARGET_COMPANY").isEmpty())
            companyName = project->values("QMAKE_TARGET_COMPANY").join(' ');

        QString description;
        if (!project->values("QMAKE_TARGET_DESCRIPTION").isEmpty())
            description = project->values("QMAKE_TARGET_DESCRIPTION").join(' ');

        QString copyright;
        if (!project->values("QMAKE_TARGET_COPYRIGHT").isEmpty())
            copyright = project->values("QMAKE_TARGET_COPYRIGHT").join(' ');

        QString productName;
        if (!project->values("QMAKE_TARGET_PRODUCT").isEmpty())
            productName = project->values("QMAKE_TARGET_PRODUCT").join(' ');
        else
            productName = project->first("TARGET").toQString();

        QString originalName;
        if (!project->values("QMAKE_TARGET_ORIGINAL_FILENAME").isEmpty())
            originalName = project->values("QMAKE_TARGET_ORIGINAL_FILENAME").join(' ');
        else
            originalName = project->first("TARGET") + project->first("TARGET_EXT");

        QString internalName;
        if (!project->values("QMAKE_TARGET_INTERNALNAME").isEmpty())
            internalName = project->values("QMAKE_TARGET_INTERNALNAME").join(' ');

        QString comments;
        if (!project->values("QMAKE_TARGET_COMMENTS").isEmpty())
            comments = project->values("QMAKE_TARGET_COMMENTS").join(' ');

        QString trademarks;
        if (!project->values("QMAKE_TARGET_TRADEMARKS").isEmpty())
            trademarks = project->values("QMAKE_TARGET_TRADEMARKS").join(' ');

        int rcLang = project->intValue("RC_LANG", 1033);            // default: English(USA)
        int rcCodePage = project->intValue("RC_CODEPAGE", 1200);    // default: Unicode

        ts << "#include <windows.h>\n";
        ts << Qt::endl;
        if (!rcIcons.isEmpty()) {
            for (int i = 0; i < rcIcons.size(); ++i)
                ts << QString("IDI_ICON%1\tICON\t%2").arg(i + 1).arg(cQuoted(rcIcons[i])) << Qt::endl;
            ts << Qt::endl;
        }
        if (!manifestFile.isEmpty()) {
            QString manifestResourceId;
            if (project->first("TEMPLATE") == "lib")
                manifestResourceId = QStringLiteral("ISOLATIONAWARE_MANIFEST_RESOURCE_ID");
            else
                manifestResourceId = QStringLiteral("CREATEPROCESS_MANIFEST_RESOURCE_ID");
            ts << manifestResourceId << " RT_MANIFEST \"" << manifestFile << "\"\n";
        }
        ts << "VS_VERSION_INFO VERSIONINFO\n";
        ts << "\tFILEVERSION " << QString(versionString).replace(".", ",") << Qt::endl;
        ts << "\tPRODUCTVERSION " << QString(versionString).replace(".", ",") << Qt::endl;
        ts << "\tFILEFLAGSMASK 0x3fL\n";
        ts << "#ifdef _DEBUG\n";
        ts << "\tFILEFLAGS VS_FF_DEBUG\n";
        ts << "#else\n";
        ts << "\tFILEFLAGS 0x0L\n";
        ts << "#endif\n";
        ts << "\tFILEOS VOS_NT_WINDOWS32\n";
        if (project->isActiveConfig("shared"))
            ts << "\tFILETYPE VFT_DLL\n";
        else
            ts << "\tFILETYPE VFT_APP\n";
        ts << "\tFILESUBTYPE VFT2_UNKNOWN\n";
        ts << "\tBEGIN\n";
        ts << "\t\tBLOCK \"StringFileInfo\"\n";
        ts << "\t\tBEGIN\n";
        ts << "\t\t\tBLOCK \""
           << QString("%1%2").arg(rcLang, 4, 16, QLatin1Char('0')).arg(rcCodePage, 4, 16, QLatin1Char('0'))
           << "\"\n";
        ts << "\t\t\tBEGIN\n";
        ts << "\t\t\t\tVALUE \"CompanyName\", \"" << companyName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"FileDescription\", \"" <<  description << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"FileVersion\", \"" << versionString << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"LegalCopyright\", \"" << copyright << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"OriginalFilename\", \"" << originalName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"ProductName\", \"" << productName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"ProductVersion\", \"" << versionString << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"InternalName\", \"" << internalName << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"Comments\", \"" << comments << "\\0\"\n";
        ts << "\t\t\t\tVALUE \"LegalTrademarks\", \"" << trademarks << "\\0\"\n";
        ts << "\t\t\tEND\n";
        ts << "\t\tEND\n";
        ts << "\t\tBLOCK \"VarFileInfo\"\n";
        ts << "\t\tBEGIN\n";
        ts << "\t\t\tVALUE \"Translation\", "
           << QString("0x%1").arg(rcLang, 4, 16, QLatin1Char('0'))
           << ", " << QString("%1").arg(rcCodePage, 4) << Qt::endl;
        ts << "\t\tEND\n";
        ts << "\tEND\n";
        ts << "/* End of Version info */\n";
        ts << Qt::endl;

        ts.flush();


        QString rcFilename = project->first("OUT_PWD")
                           + "/"
                           + project->first("TARGET")
                           + "_resource"
                           + ".rc";
        QFile rcFile(QDir::cleanPath(rcFilename));

        bool writeRcFile = true;
        if (rcFile.exists() && rcFile.open(QFile::ReadOnly)) {
            writeRcFile = rcFile.readAll() != rcString;
            rcFile.close();
        }
        if (writeRcFile) {
            bool ok;
            ok = rcFile.open(QFile::WriteOnly);
            if (!ok) {
                // The file can't be opened... try creating the containing
                // directory first (needed for clean shadow builds)
                QDir().mkpath(QFileInfo(rcFile).path());
                ok = rcFile.open(QFile::WriteOnly);
            }
            if (!ok) {
                ::fprintf(stderr, "Cannot open for writing: %s", rcFile.fileName().toLatin1().constData());
                ::exit(1);
            }
            rcFile.write(rcString);
            rcFile.close();
        }
        if (project->values("QMAKE_WRITE_DEFAULT_RC").isEmpty())
            project->values("RC_FILE").insert(0, rcFile.fileName());
    }
    if (!project->values("RC_FILE").isEmpty()) {
        if (!project->values("RES_FILE").isEmpty()) {
            fprintf(stderr, "Both rc and res file specified.\n");
            fprintf(stderr, "Please specify one of them, not both.");
            exit(1);
        }
        QString resFile = project->first("RC_FILE").toQString();

        // if this is a shadow build then use the absolute path of the rc file
        if (Option::output_dir != qmake_getpwd()) {
            QFileInfo fi(resFile);
            project->values("RC_FILE").first() = fi.absoluteFilePath();
        }

        resFile.replace(QLatin1String(".rc"), Option::res_ext);
        project->values("RES_FILE").prepend(fileInfo(resFile).fileName());
        QString resDestDir;
        if (project->isActiveConfig("staticlib"))
            resDestDir = project->first("DESTDIR").toQString();
        else
            resDestDir = project->first("OBJECTS_DIR").toQString();
        if (!resDestDir.isEmpty()) {
            resDestDir.append(Option::dir_sep);
            project->values("RES_FILE").first().prepend(resDestDir);
        }
        project->values("RES_FILE").first() = Option::fixPathToTargetOS(
                    project->first("RES_FILE").toQString(), false);
        project->values("POST_TARGETDEPS") += project->values("RES_FILE");
        project->values("CLEAN_FILES") += project->values("RES_FILE");
    }
}